

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O0

istream * operator>>(istream *is,half *h)

{
  half *in_RSI;
  istream *in_RDI;
  float f;
  half *unaff_retaddr;
  half local_16;
  float local_14;
  half *local_10;
  
  local_10 = in_RSI;
  std::istream::operator>>(in_RDI,&local_14);
  half::half(unaff_retaddr,(float)((ulong)in_RDI >> 0x20));
  half::operator=(local_10,local_16);
  return (istream *)in_RDI;
}

Assistant:

HALF_EXPORT istream &
operator >> (istream &is, half &h)
{
    float f;
    is >> f;
    h = half (f);
    return is;
}